

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_tcp_ref4(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t h;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_b = (int64_t)iVar1;
  h.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    uVar2 = uv_default_loop();
    uv_tcp_init(uVar2,&h);
    uv_tcp_connect(&connect_req,&h,&addr,connect_and_write);
    uv_unref(&h);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    eval_b = 1;
    lVar3 = (long)connect_cb_called;
    if (lVar3 == 1) {
      eval_b = 1;
      lVar3 = (long)write_cb_called;
      if (lVar3 == 1) {
        eval_b = 1;
        lVar3 = (long)shutdown_cb_called;
        if (lVar3 == 1) {
          do_close(&h);
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_b = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          lVar3 = (long)iVar1;
          if (lVar3 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(uv_default_loop())";
          pcVar4 = "0";
          uVar2 = 0x125;
        }
        else {
          pcVar5 = "shutdown_cb_called";
          pcVar4 = "1";
          uVar2 = 0x123;
        }
      }
      else {
        pcVar5 = "write_cb_called";
        pcVar4 = "1";
        uVar2 = 0x122;
      }
    }
    else {
      pcVar5 = "connect_cb_called";
      pcVar4 = "1";
      uVar2 = 0x121;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x119;
    lVar3 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,uVar2,pcVar4,"==",pcVar5,eval_b,"==",lVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_ref4) {
  struct sockaddr_in addr;
  uv_tcp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_tcp_init(uv_default_loop(), &h);
  uv_tcp_connect(&connect_req,
                 &h,
                 (const struct sockaddr*) &addr,
                 connect_and_write);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}